

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageFilledEllipse(gdImagePtr im,int mx,int my,int w,int h,int c)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int x;
  int iVar5;
  undefined4 local_70;
  undefined4 local_6c;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_48;
  
  local_6c = w >> 1;
  lVar1 = (long)local_6c;
  local_70 = mx - local_6c;
  local_68 = mx + lVar1;
  if ((long)local_70 <= (long)local_68) {
    lVar3 = (long)local_70 + -1;
    iVar4 = local_70;
    do {
      gdImageSetPixel(im,iVar4,my,c);
      lVar3 = lVar3 + 1;
      iVar4 = iVar4 + 1;
    } while (lVar3 < (long)local_68);
  }
  if (0 < local_6c) {
    lVar3 = (long)(h >> 1) * (long)(h >> 1);
    lVar2 = lVar3 * lVar1;
    local_48 = lVar2 * 2;
    local_60 = 0;
    iVar4 = my;
    iVar5 = -2;
    do {
      if (0 < lVar2) {
        my = my + 1;
        iVar4 = iVar4 + -1;
        local_60 = local_60 + lVar1 * lVar1 * 2;
        lVar2 = lVar2 - local_60;
      }
      if (lVar2 < 1) {
        local_6c = local_6c + -1;
        local_70 = local_70 + 1;
        local_68 = (ulong)((int)local_68 - 1);
        local_48 = local_48 + lVar3 * -2;
        lVar2 = lVar2 + local_48;
      }
      if (iVar5 != iVar4) {
        if (local_70 <= (int)local_68) {
          x = local_70;
          do {
            gdImageSetPixel(im,x,my,c);
            x = x + 1;
          } while ((int)local_68 + 1 != x);
        }
        if ((iVar5 != iVar4) && (local_70 <= (int)local_68)) {
          iVar5 = local_70;
          do {
            gdImageSetPixel(im,iVar5,iVar4,c);
            iVar5 = iVar5 + 1;
          } while ((int)local_68 + 1 != iVar5);
        }
      }
      iVar5 = iVar4;
    } while (0 < local_6c);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFilledEllipse (gdImagePtr im, int mx, int my, int w, int h, int c)
{
	int x=0,mx1=0,mx2=0,my1=0,my2=0;
	long aq,bq,dx,dy,r,rx,ry,a,b;
	int i;
	int old_y2;

	a=w>>1;
	b=h>>1;

	for (x = mx-a; x <= mx+a; x++) {
		gdImageSetPixel(im, x, my, c);
	}

	mx1 = mx-a;
	my1 = my;
	mx2 = mx+a;
	my2 = my;

	aq = a * a;
	bq = b * b;
	dx = aq << 1;
	dy = bq << 1;
	r  = a * bq;
	rx = r << 1;
	ry = 0;
	x = a;
	old_y2=-2;
	while (x > 0) {
		if (r > 0) {
			my1++;
			my2--;
			ry +=dx;
			r  -=ry;
		}
		if (r <= 0) {
			x--;
			mx1++;
			mx2--;
			rx -=dy;
			r  +=rx;
		}
		if(old_y2!=my2) {
			for(i=mx1; i<=mx2; i++) {
				gdImageSetPixel(im,i,my1,c);
			}
		}
		if(old_y2!=my2) {
			for(i=mx1; i<=mx2; i++) {
				gdImageSetPixel(im,i,my2,c);
			}
		}
		old_y2 = my2;
	}
}